

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::UdpEntrySyntax*>::emplace_back<slang::syntax::UdpEntrySyntax*>
          (SmallVectorBase<slang::syntax::UdpEntrySyntax*> *this,UdpEntrySyntax **args)

{
  iterator ppUVar1;
  UdpEntrySyntax **args_local;
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppUVar1 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end
                        ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
    this_local = (SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)
                 emplaceRealloc<slang::syntax::UdpEntrySyntax*>(this,ppUVar1,args);
  }
  else {
    ppUVar1 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::end
                        ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
    *ppUVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)
                 SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::back
                           ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }